

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_FindGateInput(Mio_Gate_t *pGate,char *pName)

{
  int iVar1;
  char *pcVar2;
  Mio_Gate_t *pMVar3;
  int local_2c;
  Mio_Pin_t *pMStack_28;
  int i;
  Mio_Pin_t *pGatePin;
  char *pName_local;
  Mio_Gate_t *pGate_local;
  
  local_2c = 0;
  pMStack_28 = Mio_GateReadPins(pGate);
  while (pMStack_28 != (Mio_Pin_t *)0x0) {
    pcVar2 = Mio_PinReadName(pMStack_28);
    iVar1 = strcmp(pName,pcVar2);
    if (iVar1 == 0) {
      return local_2c;
    }
    pMStack_28 = Mio_PinReadNext(pMStack_28);
    local_2c = local_2c + 1;
  }
  pcVar2 = Mio_GateReadOutName(pGate);
  iVar1 = strcmp(pName,pcVar2);
  if (iVar1 == 0) {
    pGate_local._4_4_ = local_2c;
  }
  else {
    pMVar3 = Mio_GateReadTwin(pGate);
    if (pMVar3 != (Mio_Gate_t *)0x0) {
      pMVar3 = Mio_GateReadTwin(pGate);
      pcVar2 = Mio_GateReadOutName(pMVar3);
      iVar1 = strcmp(pName,pcVar2);
      if (iVar1 == 0) {
        return local_2c + 1;
      }
    }
    pGate_local._4_4_ = -1;
  }
  return pGate_local._4_4_;
}

Assistant:

int Ver_FindGateInput( Mio_Gate_t * pGate, char * pName )
{
    Mio_Pin_t * pGatePin;
    int i;
    for ( i = 0, pGatePin = Mio_GateReadPins(pGate); pGatePin != NULL; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        if ( strcmp(pName, Mio_PinReadName(pGatePin)) == 0 )
            return i;
    if ( strcmp(pName, Mio_GateReadOutName(pGate)) == 0 )
        return i;
    if ( Mio_GateReadTwin(pGate) && strcmp(pName, Mio_GateReadOutName(Mio_GateReadTwin(pGate))) == 0 )
        return i+1;
    return -1;
}